

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row_avg(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  size_t sVar1;
  uint uVar2;
  size_t istop;
  byte *pbStack_38;
  uint bpp;
  png_const_bytep pp;
  png_bytep rp;
  size_t i;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar2 = (int)(row_info->pixel_depth + 7) >> 3;
  sVar1 = row_info->rowbytes;
  pbStack_38 = prev_row;
  pp = row;
  for (rp = (png_bytep)0x0; rp < (png_bytep)(ulong)uVar2; rp = rp + 1) {
    *pp = *pp + *pbStack_38 / 2;
    pp = pp + 1;
    pbStack_38 = pbStack_38 + 1;
  }
  for (rp = (png_bytep)0x0; rp < (png_bytep)(sVar1 - uVar2); rp = rp + 1) {
    *pp = *pp + (char)((ulong)((uint)*pbStack_38 + (uint)pp[-(ulong)uVar2]) / 2);
    pp = pp + 1;
    pbStack_38 = pbStack_38 + 1;
  }
  return;
}

Assistant:

static void
png_read_filter_row_avg(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   size_t i;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   size_t istop = row_info->rowbytes - bpp;

   for (i = 0; i < bpp; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         ((int)(*pp++) / 2 )) & 0xff);

      rp++;
   }

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) +
         (int)(*pp++ + *(rp-bpp)) / 2 ) & 0xff);

      rp++;
   }
}